

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_builder.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::subject::SubjectBuilder::GetComponent
          (string *__return_storage_ptr__,SubjectBuilder *this,string *key)

{
  ulong uVar1;
  __type _Var2;
  size_type sVar3;
  reference pvVar4;
  allocator<char> local_29;
  ulong local_28;
  unsigned_long i;
  string *key_local;
  SubjectBuilder *this_local;
  
  local_28 = 0;
  i = (unsigned_long)key;
  key_local = (string *)this;
  this_local = (SubjectBuilder *)__return_storage_ptr__;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->components_);
    if (sVar3 <= uVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_29);
      std::allocator<char>::~allocator(&local_29);
      return __return_storage_ptr__;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->components_,local_28);
    _Var2 = std::operator==(pvVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)i);
    if (_Var2) break;
    local_28 = local_28 + 2;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this->components_,local_28 + 1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectBuilder::GetComponent(const std::string& key)
{
    for (unsigned long i = 0; i < components_.size(); i+= 2)
    {
        if ((components_.at(i)) == key)
        {
            return components_.at(i + 1);
        }
    }

    return "";
}